

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O3

void KDict_Add(KonohaContext *kctx,KDict *dict,KKeyValue *kvs)

{
  ksymbol_t *pkVar1;
  ulong uVar2;
  ksymbol_t kVar3;
  ksymbol_t kVar4;
  ksymbol_t kVar5;
  ulong uVar6;
  
  uVar2 = (dict->data).bytesize;
  KDict_Ensure(kctx,dict,1);
  kVar3 = kvs->typeAttr;
  kVar4 = *(ksymbol_t *)&kvs->field_2;
  kVar5 = *(ksymbol_t *)((long)&kvs->field_2 + 4);
  pkVar1 = (ksymbol_t *)((dict->data).field_1.bytebuf + (uVar2 & 0xfffffffffffffff0));
  *pkVar1 = kvs->key;
  pkVar1[1] = kVar3;
  pkVar1[2] = kVar4;
  pkVar1[3] = kVar5;
  uVar6 = (dict->data).bytesize + 0x10;
  (dict->data).bytesize = uVar6;
  if (8 < (uVar2 >> 4) - dict->sortedData) {
    uVar6 = uVar6 >> 4;
    (*kctx->platApi->qsort_i)((dict->data).field_1.bytebuf,uVar6,0x10,comprKeyVal);
    dict->sortedData = uVar6;
  }
  return;
}

Assistant:

KLIBDECL void KDict_Add(KonohaContext *kctx, KDict *dict, KKeyValue *kvs)
{
	size_t size = KDict_size(dict);
	KDict_Ensure(kctx, dict, 1);
	memcpy(dict->data.keyValueItems + size, kvs, sizeof(KKeyValue));
	dict->data.bytesize += sizeof(KKeyValue);
	if(size - dict->sortedData > 8) {
		KDict_Sort(kctx, dict);
	}
}